

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

char * mbedtls_md_get_name(mbedtls_md_info_t *md_info)

{
  bool bVar1;
  md_name_entry *local_20;
  md_name_entry *entry;
  mbedtls_md_info_t *md_info_local;
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    md_info_local = (mbedtls_md_info_t *)0x0;
  }
  else {
    local_20 = md_names;
    while( true ) {
      bVar1 = false;
      if (local_20->md_type != MBEDTLS_MD_NONE) {
        bVar1 = local_20->md_type != md_info->type;
      }
      if (!bVar1) break;
      local_20 = local_20 + 1;
    }
    md_info_local = (mbedtls_md_info_t *)local_20->md_name;
  }
  return (char *)md_info_local;
}

Assistant:

const char *mbedtls_md_get_name(const mbedtls_md_info_t *md_info)
{
    if (md_info == NULL) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_type != MBEDTLS_MD_NONE &&
           entry->md_type != md_info->type) {
        ++entry;
    }

    return entry->md_name;
}